

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate_foreach_macro.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  ostream *in_RSI;
  int in_EDI;
  int max_iteration;
  int local_18;
  
  if (in_EDI < 2) {
    local_18 = 0x400;
  }
  else {
    local_18 = atoi(*(char **)(in_RSI + 8));
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"#ifndef ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_DETAIL_FOREACH_HPP");
  poVar1 = std::operator<<(poVar1,"\n");
  poVar1 = std::operator<<(poVar1,"#define ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_DETAIL_FOREACH_HPP");
  std::operator<<(poVar1,"\n\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"// Generated by GenerateForeachMacro ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,local_18);
  std::operator<<(poVar1,"\n");
  write_count(in_RSI,local_18);
  write_foreach(in_RSI,local_18);
  poVar1 = std::operator<<((ostream *)&std::cout,"\n#endif // ");
  poVar1 = std::operator<<(poVar1,"MSERIALIZE_DETAIL_FOREACH_HPP");
  std::operator<<(poVar1,"\n");
  return 0;
}

Assistant:

int main(int argc, const char* argv[])
{
  /** The max number of arguments FOREACH will call F */
  const int max_iteration = (argc >= 2) ? std::atoi(argv[1]) : 1024; // NOLINT

  std::cout << "#ifndef " << header_guard << "\n"
            << "#define " << header_guard << "\n\n";

  std::cout << "// Generated by GenerateForeachMacro " << max_iteration << "\n";

  write_count(std::cout, max_iteration+1);
  write_foreach(std::cout, max_iteration);

  std::cout << "\n#endif // " << header_guard << "\n";
}